

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenBoundingBoxesProcess.cpp
# Opt level: O0

void __thiscall
Assimp::GenBoundingBoxesProcess::Execute(GenBoundingBoxesProcess *this,aiScene *pScene)

{
  aiMesh *mesh_00;
  undefined1 local_40 [8];
  aiVector3D max;
  aiVector3D min;
  aiMesh *mesh;
  uint i;
  aiScene *pScene_local;
  GenBoundingBoxesProcess *this_local;
  
  if (pScene != (aiScene *)0x0) {
    for (mesh._4_4_ = 0; mesh._4_4_ < pScene->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
      mesh_00 = pScene->mMeshes[mesh._4_4_];
      if (mesh_00 != (aiMesh *)0x0) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&max.y,999999.0,999999.0,999999.0);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_40,-999999.0,-999999.0,-999999.0);
        checkMesh(mesh_00,(aiVector3D *)&max.y,(aiVector3D *)local_40);
        (mesh_00->mAABB).mMin.x = max.y;
        (mesh_00->mAABB).mMin.y = max.z;
        (mesh_00->mAABB).mMin.z = min.x;
        (mesh_00->mAABB).mMax.x = (float)local_40._0_4_;
        (mesh_00->mAABB).mMax.y = (float)local_40._4_4_;
        (mesh_00->mAABB).mMax.z = max.x;
      }
    }
  }
  return;
}

Assistant:

void GenBoundingBoxesProcess::Execute(aiScene* pScene) {
    if (nullptr == pScene) {
        return;
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh* mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        aiVector3D min(999999, 999999, 999999), max(-999999, -999999, -999999);
        checkMesh(mesh, min, max);
        mesh->mAABB.mMin = min;
        mesh->mAABB.mMax = max;
    }
}